

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int SetCVar(AActor *activator,char *cvarname,int value,bool is_string)

{
  int iVar1;
  FBaseCVar *cvar;
  int iVar2;
  
  iVar2 = 0;
  cvar = FindCVar(cvarname,(FBaseCVar **)0x0);
  iVar1 = 0;
  if ((cvar != (FBaseCVar *)0x0) && (iVar1 = iVar2, (cvar->Flags & 0x6008) == 0x2000)) {
    if ((cvar->Flags & 2) == 0) {
      DoSetCVar(cvar,value,is_string,false);
      iVar1 = 1;
    }
    else if ((activator != (AActor *)0x0) && (activator->player != (player_t *)0x0)) {
      iVar1 = SetUserCVar((int)((ulong)&activator->player[-0x91ab].ConversationNPCAngle >> 5) *
                          0x3cf3cf3d,cvarname,value,is_string);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int SetCVar(AActor *activator, const char *cvarname, int value, bool is_string)
{
	FBaseCVar *cvar = FindCVar(cvarname, NULL);
	// Only mod-created cvars may be set.
	if (cvar == NULL || (cvar->GetFlags() & (CVAR_IGNORE|CVAR_NOSET)) || !(cvar->GetFlags() & CVAR_MOD))
	{
		return 0;
	}
	// For userinfo cvars, redirect to SetUserCVar
	if (cvar->GetFlags() & CVAR_USERINFO)
	{
		if (activator == NULL || activator->player == NULL)
		{
			return 0;
		}
		return SetUserCVar(int(activator->player - players), cvarname, value, is_string);
	}
	DoSetCVar(cvar, value, is_string);
	return 1;
}